

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlRecoverFile(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 in_RAX;
  xmlDocPtr doc;
  PyObject *pPVar2;
  char *filename;
  undefined8 local_18;
  
  local_18 = in_RAX;
  iVar1 = libxml_deprecationWarning("xmlRecoverFile");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"z:xmlRecoverFile",&local_18);
    if (iVar1 != 0) {
      doc = (xmlDocPtr)xmlRecoverFile(local_18);
      pPVar2 = libxml_xmlDocPtrWrap(doc);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlRecoverFile(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlDocPtr c_retval;
    char * filename;

    if (libxml_deprecationWarning("xmlRecoverFile") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"z:xmlRecoverFile", &filename))
        return(NULL);

    c_retval = xmlRecoverFile(filename);
    py_retval = libxml_xmlDocPtrWrap((xmlDocPtr) c_retval);
    return(py_retval);
}